

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O1

Error __thiscall
asmjit::ZoneVector<asmjit::CBPass_*>::append
          (ZoneVector<asmjit::CBPass_*> *this,ZoneHeap *heap,CBPass **item)

{
  size_t *psVar1;
  Error EVar2;
  
  if (((this->super_ZoneVectorBase)._length != (this->super_ZoneVectorBase)._capacity) ||
     (EVar2 = ZoneVectorBase::_grow(&this->super_ZoneVectorBase,heap,8,1), EVar2 == 0)) {
    *(CBPass **)
     ((long)(this->super_ZoneVectorBase)._data + (this->super_ZoneVectorBase)._length * 8) = *item;
    psVar1 = &(this->super_ZoneVectorBase)._length;
    *psVar1 = *psVar1 + 1;
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error append(ZoneHeap* heap, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_length == _capacity))
      ASMJIT_PROPAGATE(grow(heap, 1));

    ::memcpy(static_cast<T*>(_data) + _length, &item, sizeof(T));

    _length++;
    return kErrorOk;
  }